

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>,slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *pSVar4;
  
  pSVar4 = (SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)this->endPtr < pSVar4 + 1) {
    pSVar4 = (SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)
             allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pSVar4 + 1);
  }
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar4->super_SyntaxListBase).super_SyntaxNode.field_0x4 = uVar3;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent = pSVar1;
  (pSVar4->super_SyntaxListBase)._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00622e60;
  (pSVar4->super_SyntaxListBase).childCount = (args->super_SyntaxListBase).childCount;
  sVar2 = (args->
          super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pSVar4->super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>)
  ._M_ptr = (args->
            super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>
            )._M_ptr;
  (pSVar4->super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>)
  ._M_extent._M_extent_value = sVar2;
  (pSVar4->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00624248;
  return pSVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }